

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void typeofFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  char *in_RDX;
  undefined4 in_ESI;
  int i;
  _func_void_void_ptr *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = sqlite3_value_type(*(sqlite3_value **)in_RDX);
  sqlite3_result_text((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                      iVar1 + -1,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void typeofFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  static const char *azType[] = { "integer", "real", "text", "blob", "null" };
  int i = sqlite3_value_type(argv[0]) - 1;
  UNUSED_PARAMETER(NotUsed);
  assert( i>=0 && i<ArraySize(azType) );
  assert( SQLITE_INTEGER==1 );
  assert( SQLITE_FLOAT==2 );
  assert( SQLITE_TEXT==3 );
  assert( SQLITE_BLOB==4 );
  assert( SQLITE_NULL==5 );
  /* EVIDENCE-OF: R-01470-60482 The sqlite3_value_type(V) interface returns
  ** the datatype code for the initial datatype of the sqlite3_value object
  ** V. The returned value is one of SQLITE_INTEGER, SQLITE_FLOAT,
  ** SQLITE_TEXT, SQLITE_BLOB, or SQLITE_NULL. */
  sqlite3_result_text(context, azType[i], -1, SQLITE_STATIC);
}